

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O0

void __thiscall asl::HttpServer::serve(HttpServer *this,Socket *client)

{
  WebSocketServer *this_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  String *pSVar6;
  Dic<asl::String> *headers;
  ByteArray *this_01;
  undefined8 in_RCX;
  undefined7 uVar8;
  size_t sVar7;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  undefined1 *puVar9;
  Endian *name;
  double dVar10;
  bool local_6b2;
  bool local_649;
  byte local_601;
  String local_5e8;
  String local_5d0;
  String local_5b8;
  String local_5a0;
  String local_588;
  uint local_570;
  int local_56c;
  int end;
  int begin;
  String local_550;
  undefined1 local_538 [8];
  Array<asl::String> parts;
  undefined1 local_518 [8];
  String range;
  String local_4e8;
  String local_4d0;
  String local_4b8;
  String local_4a0;
  String local_488;
  Date local_470;
  String local_468;
  String local_450;
  String local_438;
  String local_420;
  undefined1 local_408 [8];
  String mime;
  String local_3d8;
  String local_3c0;
  undefined1 local_3a8 [8];
  File file;
  String local_348;
  String local_330;
  String local_318;
  String local_300;
  String local_2e8;
  String local_2d0;
  String local_2b8;
  byte local_299;
  String local_298;
  undefined1 local_280 [8];
  HttpResponse response;
  String local_1e0;
  String local_1c8;
  String local_1b0;
  undefined1 local_198 [8];
  String hconn;
  undefined1 local_170 [8];
  HttpRequest request;
  double t1;
  Socket *client_local;
  HttpServer *this_local;
  
  request._328_8_ = now();
  do {
    bVar1 = Socket::connected(client);
    in_RCX = CONCAT71((int7)((ulong)in_RCX >> 8),bVar1);
    local_601 = 0;
    if (bVar1) {
      dVar10 = now();
      local_601 = 0;
      if (dVar10 - (double)request._328_8_ < 10.0) {
        local_601 = (this->super_SocketServer)._requestStop ^ 0xff;
      }
    }
    if ((local_601 & 1) == 0) {
      return;
    }
    bVar1 = Socket::waitData(client,5.0);
  } while (!bVar1);
  HttpRequest::HttpRequest((HttpRequest *)local_170,client);
  iVar3 = Socket::error(client);
  if (iVar3 == 0) {
    pSVar6 = HttpRequest::method((HttpRequest *)local_170);
    bVar1 = asl::String::ok(pSVar6);
    if (bVar1) {
      pSVar6 = HttpRequest::path((HttpRequest *)local_170);
      bVar1 = asl::String::ok(pSVar6);
      if (bVar1) {
        pSVar6 = HttpMessage::protocol((HttpMessage *)local_170);
        bVar1 = asl::String::ok(pSVar6);
        if (bVar1) {
          asl::String::String(&local_1c8,"Connection");
          HttpMessage::header(&local_1b0,(HttpMessage *)local_170,&local_1c8);
          asl::String::toLowerCase((String *)local_198,&local_1b0);
          asl::String::~String(&local_1b0);
          asl::String::~String(&local_1c8);
          asl::String::String((String *)&response._code,"Upgrade");
          HttpMessage::header(&local_1e0,(HttpMessage *)local_170,(String *)&response._code);
          bVar2 = asl::String::operator==(&local_1e0,"websocket");
          uVar8 = (undefined7)((ulong)in_RCX >> 8);
          bVar1 = false;
          if (bVar2) {
            bVar1 = this->_wsserver != (WebSocketServer *)0x0;
          }
          asl::String::~String(&local_1e0);
          asl::String::~String((String *)&response._code);
          if (bVar1) {
            if ((verbose & 1) != 0) {
              printf("handing over to ws\n");
            }
            this_00 = this->_wsserver;
            headers = HttpMessage::headers((HttpMessage *)local_170);
            WebSocketServer::process(this_00,client,headers);
            hconn.field_2._8_4_ = 1;
          }
          else {
            HttpResponse::HttpResponse((HttpResponse *)local_280,(HttpRequest *)local_170);
            sVar7 = CONCAT71(uVar8,this->_cors);
            local_299 = 0;
            local_649 = false;
            if ((this->_cors & 1U) != 0) {
              asl::String::String(&local_298,"Origin");
              local_299 = 1;
              local_649 = HttpMessage::hasHeader((HttpMessage *)local_170,&local_298);
            }
            if ((local_299 & 1) != 0) {
              asl::String::~String(&local_298);
            }
            if (local_649 != false) {
              asl::String::String(&local_2b8,"Access-Control-Allow-Origin");
              asl::String::String(&local_2e8,"Origin");
              HttpMessage::header(&local_2d0,(HttpMessage *)local_170,&local_2e8);
              HttpMessage::setHeader((HttpMessage *)local_280,&local_2b8,&local_2d0);
              asl::String::~String(&local_2d0);
              asl::String::~String(&local_2e8);
              asl::String::~String(&local_2b8);
              asl::String::String(&local_300,"Access-Control-Allow-Credentials");
              asl::String::String(&local_318,"true");
              HttpMessage::setHeader((HttpMessage *)local_280,&local_300,&local_318);
              asl::String::~String(&local_318);
              asl::String::~String(&local_300);
            }
            bVar1 = asl::String::operator==((String *)local_198,"keep-alive");
            if (bVar1) {
              asl::String::String(&local_330,"Connection");
              asl::String::String(&local_348,"keep-alive");
              HttpMessage::setHeader((HttpMessage *)local_280,&local_330,&local_348);
              asl::String::~String(&local_348);
              asl::String::~String(&local_330);
            }
            uVar4 = (*(this->super_SocketServer)._vptr_SocketServer[2])(this,local_170,local_280);
            if ((uVar4 & 1) == 0) {
              puVar9 = local_170;
              (*(this->super_SocketServer)._vptr_SocketServer[1])(this,puVar9,local_280);
              iVar3 = (int)puVar9;
              this_01 = HttpMessage::body((HttpMessage *)local_280);
              bVar1 = Array<unsigned_char>::operator!(this_01);
              if (bVar1) {
                iVar3 = 0x1767b5;
                HttpMessage::put((HttpMessage *)local_280,"");
              }
              iVar5 = HttpResponse::code((HttpResponse *)local_280);
              if (iVar5 == 0x195) {
                asl::String::String((String *)&file._endian,"Allow");
                name = &file._endian;
                HttpMessage::setHeader((HttpMessage *)local_280,(String *)name,&this->_methods);
                iVar3 = (int)name;
                asl::String::~String((String *)&file._endian);
              }
              bVar1 = HttpMessage::containsFile((HttpMessage *)local_280);
              if (!bVar1) {
                HttpMessage::write((HttpMessage *)local_280,iVar3,__buf,sVar7);
                goto LAB_0013edd3;
              }
              HttpMessage::text(&local_3c0,(HttpMessage *)local_280);
              File::File((File *)local_3a8,&local_3c0);
              asl::String::~String(&local_3c0);
              bVar1 = File::isFile((File *)local_3a8);
              if (bVar1) {
                File::extension(&local_420,(File *)local_3a8);
                asl::String::String(&local_438,"text/plain");
                pSVar6 = Map<asl::String,_asl::String>::get
                                   (&(this->_mimetypes).super_Map<asl::String,_asl::String>,
                                    &local_420,&local_438);
                asl::String::String((String *)local_408,pSVar6);
                asl::String::~String(&local_438);
                asl::String::~String(&local_420);
                asl::String::String(&local_450,"Date");
                Date::now();
                Date::toString(&local_468,&local_470,HTTP);
                HttpMessage::setHeader((HttpMessage *)local_280,&local_450,&local_468);
                asl::String::~String(&local_468);
                asl::String::~String(&local_450);
                asl::String::String(&local_488,"Content-Type");
                bVar1 = HttpMessage::hasHeader((HttpMessage *)local_280,&local_488);
                asl::String::~String(&local_488);
                if (((bVar1 ^ 0xffU) & 1) != 0) {
                  asl::String::String(&local_4a0,"Content-Type");
                  HttpMessage::setHeader((HttpMessage *)local_280,&local_4a0,(String *)local_408);
                  asl::String::~String(&local_4a0);
                }
                asl::String::String(&local_4b8,"Cache-Control");
                bVar1 = HttpMessage::hasHeader((HttpMessage *)local_280,&local_4b8);
                asl::String::~String(&local_4b8);
                if (((bVar1 ^ 0xffU) & 1) != 0) {
                  asl::String::String(&local_4d0,"Cache-Control");
                  asl::String::String(&local_4e8,"max-age=60, public");
                  HttpMessage::setHeader((HttpMessage *)local_280,&local_4d0,&local_4e8);
                  asl::String::~String(&local_4e8);
                  asl::String::~String(&local_4d0);
                }
                asl::String::String((String *)((long)&range.field_2 + 8),"Range");
                bVar1 = HttpMessage::hasHeader
                                  ((HttpMessage *)local_170,(String *)((long)&range.field_2 + 8));
                asl::String::~String((String *)((long)&range.field_2 + 8));
                if (bVar1) {
                  asl::String::String((String *)&parts,"Range");
                  HttpMessage::header((String *)local_518,(HttpMessage *)local_170,(String *)&parts)
                  ;
                  asl::String::~String((String *)&parts);
                  bVar1 = asl::String::startsWith((String *)local_518,"bytes=");
                  if ((bVar1) && (bVar1 = asl::String::contains((String *)local_518,','), !bVar1)) {
                    asl::String::substr(&local_550,(String *)local_518,6);
                    asl::String::String((String *)&end,'-');
                    asl::String::split((String *)local_538,&local_550);
                    asl::String::~String((String *)&end);
                    asl::String::~String(&local_550);
                    pSVar6 = Array<asl::String>::operator[]((Array<asl::String> *)local_538,0);
                    local_56c = asl::String::operator_cast_to_int(pSVar6);
                    pSVar6 = Array<asl::String>::operator[]((Array<asl::String> *)local_538,1);
                    local_570 = asl::String::operator_cast_to_int(pSVar6);
                    HttpResponse::setCode((HttpResponse *)local_280,0xce);
                    asl::String::String(&local_588,"Content-Range");
                    asl::String::String(&local_5a0,"+");
                    HttpMessage::setHeader((HttpMessage *)local_280,&local_588,&local_5a0);
                    asl::String::~String(&local_5a0);
                    asl::String::~String(&local_588);
                    pSVar6 = File::path((File *)local_3a8);
                    sVar7 = (size_t)local_570;
                    HttpMessage::putFile((HttpMessage *)local_280,pSVar6,local_56c,local_570);
                    Array<asl::String>::~Array((Array<asl::String> *)local_538);
                  }
                  asl::String::~String((String *)local_518);
                }
                else {
                  pSVar6 = File::path((File *)local_3a8);
                  sVar7 = 0;
                  HttpMessage::putFile((HttpMessage *)local_280,pSVar6,0,0);
                }
                asl::String::String(&local_5b8,"Content-Range");
                bVar1 = HttpMessage::hasHeader((HttpMessage *)local_280,&local_5b8);
                sVar7 = CONCAT71((int7)(sVar7 >> 8),bVar1);
                local_6b2 = false;
                if (bVar1) {
                  asl::String::String(&local_5e8,"Content-Range");
                  HttpMessage::header(&local_5d0,(HttpMessage *)local_280,&local_5e8);
                  local_6b2 = asl::String::contains(&local_5d0,'*');
                  asl::String::~String(&local_5d0);
                  asl::String::~String(&local_5e8);
                }
                asl::String::~String(&local_5b8);
                if (local_6b2 != false) {
                  iVar3 = 0x1a0;
                  HttpResponse::setCode((HttpResponse *)local_280,0x1a0);
                  HttpMessage::write((HttpMessage *)local_280,iVar3,__buf_01,sVar7);
                }
                asl::String::~String((String *)local_408);
                hconn.field_2._8_4_ = 0;
              }
              else {
                HttpResponse::setCode((HttpResponse *)local_280,0x194);
                asl::String::String(&local_3d8,"Content-Type");
                asl::String::String((String *)((long)&mime.field_2 + 8),"text/plain");
                HttpMessage::setHeader
                          ((HttpMessage *)local_280,&local_3d8,(String *)((long)&mime.field_2 + 8));
                asl::String::~String((String *)((long)&mime.field_2 + 8));
                asl::String::~String(&local_3d8);
                iVar3 = 0x1763bd;
                HttpMessage::put((HttpMessage *)local_280,"Not found");
                HttpMessage::write((HttpMessage *)local_280,iVar3,__buf_00,sVar7);
                hconn.field_2._8_4_ = 2;
              }
              File::~File((File *)local_3a8);
              if (hconn.field_2._8_4_ == 0) goto LAB_0013edd3;
            }
            else {
LAB_0013edd3:
              pSVar6 = HttpMessage::protocol((HttpMessage *)local_170);
              bVar1 = asl::String::operator==(pSVar6,"HTTP/1.0");
              if (((bVar1) &&
                  (bVar1 = asl::String::operator!=((String *)local_198,"keep-alive"), bVar1)) ||
                 (bVar1 = asl::String::operator==((String *)local_198,"close"), bVar1)) {
                hconn.field_2._8_4_ = 3;
              }
              else {
                hconn.field_2._8_4_ = 0;
              }
            }
            HttpResponse::~HttpResponse((HttpResponse *)local_280);
          }
          asl::String::~String((String *)local_198);
          goto LAB_0013ee8b;
        }
      }
    }
  }
  hconn.field_2._8_4_ = 3;
LAB_0013ee8b:
  HttpRequest::~HttpRequest((HttpRequest *)local_170);
  (*(code *)(&DAT_001761f0 + *(int *)(&DAT_001761f0 + (ulong)(uint)hconn.field_2._8_4_ * 4)))();
  return;
}

Assistant:

void HttpServer::serve(Socket client)
{
	double t1 = now();
	while(client.connected() && now() - t1 < 10.0 && !_requestStop)
	{
		if (!client.waitData(5))
			continue;

		HttpRequest request(client);
		if (client.error() || !request.method().ok() || !request.path().ok() || !request.protocol().ok())
			break;

		String hconn = request.header("Connection").toLowerCase();

		if (request.header("Upgrade") == "websocket" && _wsserver)
		{
			if(verbose) printf("handing over to ws\n");
			_wsserver->process(client, request.headers());
			return;
		}

		HttpResponse response(request);

		if (_cors && request.hasHeader("Origin"))
		{
			response.setHeader("Access-Control-Allow-Origin", request.header("Origin"));
			response.setHeader("Access-Control-Allow-Credentials", "true");
		}

		if (hconn == "keep-alive")
			response.setHeader("Connection", "keep-alive");

		if (!handleOptions(request, response))
		{
			serve(request, response);

			if (!response.body())
				response.put("");

			if (response.code() == 405)
				response.setHeader("Allow", _methods);

			if (response.containsFile())
			{
				File file(response.text());
				if (!file.isFile())
				{
					response.setCode(404);
					response.setHeader("Content-Type", "text/plain");
					response.put("Not found");
					response.write();
					continue;
				}

				String mime = _mimetypes.get(file.extension(), "text/plain");
				response.setHeader("Date", Date::now().toString(Date::HTTP));
				if (!response.hasHeader("Content-Type"))
					response.setHeader("Content-Type", mime);
				
				if (!response.hasHeader("Cache-Control"))
					response.setHeader("Cache-Control", "max-age=60, public");
				
				if (request.hasHeader("Range"))
				{
					String range = request.header("Range");
					if (range.startsWith("bytes=") && !range.contains(',')) // no multiple ranges
					{
						Array<String> parts = range.substr(6).split('-');
						int begin = parts[0];
						int end = parts[1];
						response.setCode(206);
						response.setHeader("Content-Range", "+");
						response.putFile(file.path(), begin, end);
					}
				}
				else
					response.putFile(file.path());

				if (response.hasHeader("Content-Range") && response.header("Content-Range").contains('*'))
				{
					response.setCode(416);
					response.write();
				}
			}
			else
				response.write();
		}
		
		if ((request.protocol() == "HTTP/1.0" && hconn != "keep-alive") || hconn == "close")
			break;
	}
}